

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void output_with_header(string *filename,string *header)

{
  ostream *poVar1;
  streambuf *psVar2;
  undefined1 local_220 [8];
  ifstream f;
  string *header_local;
  string *filename_local;
  
  std::ifstream::ifstream(local_220,(string *)filename,_S_in);
  poVar1 = std::operator<<((ostream *)&std::cout,"----- ");
  poVar1 = std::operator<<(poVar1,(string *)header);
  poVar1 = std::operator<<(poVar1," -----");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  psVar2 = (streambuf *)std::ifstream::rdbuf();
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,psVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ios::clear((long)&std::cout + *(long *)(std::cout + -0x18),0);
  poVar1 = std::operator<<((ostream *)&std::cout,"-----------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void output_with_header(const std::string& filename, const std::string& header) {
    std::ifstream f(filename);
    // Clear is needed if the file is empty.
    std::cout << "----- " << header << " -----" << std::endl;
    std::cout << f.rdbuf() << std::endl;
    std::cout.clear();
    std::cout << "-----------------" << std::endl;
}